

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  void *pvVar1;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
                 super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
                 super_SmallVectorBase.Size;
  if (uVar5 != 0) {
    pvVar1 = (this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
             super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
             super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
             super_SmallVectorBase.BeginX;
    lVar4 = 0;
    do {
      free(*(void **)((long)pvVar1 + lVar4));
      lVar4 = lVar4 + 0x10;
    } while (uVar5 << 4 != lVar4);
  }
  (this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
  super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.Size
       = 0;
  uVar5 = (ulong)(this->Slabs).super_SmallVectorImpl<void_*>.
                 super_SmallVectorTemplateBase<void_*,_true>.
                 super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size;
  if (uVar5 != 0) {
    this->BytesAllocated = 0;
    plVar2 = (long *)(this->Slabs).super_SmallVectorImpl<void_*>.
                     super_SmallVectorTemplateBase<void_*,_true>.
                     super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    pcVar3 = (char *)*plVar2;
    this->CurPtr = pcVar3;
    this->End = pcVar3 + 0x1000;
    if (uVar5 != 1) {
      lVar4 = 8;
      do {
        free(*(void **)((long)plVar2 + lVar4));
        lVar4 = lVar4 + 8;
      } while (uVar5 << 3 != lVar4);
    }
    pvVar1 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>
             .super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    SmallVectorImpl<void_*>::erase
              (&(this->Slabs).super_SmallVectorImpl<void_*>,(const_iterator)((long)pvVar1 + 8),
               (const_iterator)
               ((long)pvVar1 +
               (ulong)(this->Slabs).super_SmallVectorImpl<void_*>.
                      super_SmallVectorTemplateBase<void_*,_true>.
                      super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size * 8))
    ;
    return;
  }
  return;
}

Assistant:

void Reset() {
    // Deallocate all but the first slab, and deallocate all custom-sized slabs.
    DeallocateCustomSizedSlabs();
    CustomSizedSlabs.clear();

    if (Slabs.empty())
      return;

    // Reset the state.
    BytesAllocated = 0;
    CurPtr = (char *)Slabs.front();
    End = CurPtr + SlabSize;

    __asan_poison_memory_region(*Slabs.begin(), computeSlabSize(0));
    DeallocateSlabs(std::next(Slabs.begin()), Slabs.end());
    Slabs.erase(std::next(Slabs.begin()), Slabs.end());
  }